

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDisallowedCommand.cxx
# Opt level: O0

bool __thiscall
cmDisallowedCommand::InitialPass
          (cmDisallowedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmCommand *this_00;
  PolicyStatus PVar1;
  int iVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  PolicyID id;
  allocator<char> local_a1;
  string local_a0;
  byte local_7a;
  allocator<char> local_79;
  undefined1 local_78 [6];
  bool ret;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmDisallowedCommand *this_local;
  
  local_28 = status;
  status_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  PVar1 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,this->Policy,false);
  if (PVar1 != OLD) {
    if (PVar1 == WARN) {
      pcVar3 = (this->super_cmCommand).Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_48,(cmPolicies *)(ulong)this->Policy,id);
      cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else if (PVar1 - NEW < 3) {
      pcVar3 = (this->super_cmCommand).Makefile;
      pcVar4 = this->Message;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_78,pcVar4,&local_79);
      cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      std::allocator<char>::~allocator(&local_79);
      return true;
    }
  }
  this_00 = this->Command;
  pcVar3 = cmCommand::GetMakefile(&this->super_cmCommand);
  cmCommand::SetMakefile(this_00,pcVar3);
  iVar2 = (*this->Command->_vptr_cmCommand[3])(this->Command,status_local,local_28);
  local_7a = (byte)iVar2;
  pcVar4 = cmCommand::GetError(this->Command);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar4,&local_a1);
  cmCommand::SetError(&this->super_cmCommand,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  return (bool)(local_7a & 1);
}

Assistant:

bool cmDisallowedCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& status)
{
  switch (this->Makefile->GetPolicyStatus(this->Policy)) {
    case cmPolicies::WARN:
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING,
                                   cmPolicies::GetPolicyWarning(this->Policy));
      break;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, this->Message);
      return true;
  }

  this->Command->SetMakefile(this->GetMakefile());
  bool const ret = this->Command->InitialPass(args, status);
  this->SetError(this->Command->GetError());
  return ret;
}